

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O3

Rect __thiscall lunasvg::SVGGeometryElement::strokeBoundingBox(SVGGeometryElement *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pSVar3;
  SVGMarkerPosition *markerPosition;
  pointer pSVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar5;
  undefined8 in_XMM1_Qa;
  float fVar6;
  uint uVar7;
  uint uVar8;
  Rect RVar9;
  Rect local_48;
  Rect local_38;
  
  (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[0xb])();
  local_48.h = (float)((ulong)in_XMM1_Qa >> 0x20);
  local_48.y = extraout_XMM0_Db;
  local_48.x = extraout_XMM0_Da;
  local_48.w = (float)in_XMM1_Qa;
  if ((0.0 < (this->m_stroke).m_opacity) &&
     (((this->m_stroke).m_element != (SVGPaintElement *)0x0 ||
      (0xffffff < (this->m_stroke).m_color.m_value)))) {
    fVar6 = (this->m_strokeData).m_lineWidth * 0.5;
    uVar1 = (this->m_strokeData).m_lineCap;
    uVar2 = (this->m_strokeData).m_lineJoin;
    uVar7 = CONCAT13(-(uVar1 == '\x02'),
                     CONCAT12(-(uVar1 == '\x02'),CONCAT11(-(uVar1 == '\x02'),-(uVar1 == '\x02'))));
    uVar8 = (uint)(CONCAT17(-(uVar2 == '\0'),
                            CONCAT16(-(uVar2 == '\0'),
                                     CONCAT15(-(uVar2 == '\0'),CONCAT14(-(uVar2 == '\0'),uVar7))))
                  >> 0x20);
    fVar5 = (float)(~uVar7 & (uint)fVar6 | (uint)(fVar6 * 1.4142135) & uVar7);
    fVar6 = (float)(~uVar8 & (uint)fVar6 | (uint)((this->m_strokeData).m_miterLimit * fVar6) & uVar8
                   );
    if (fVar6 <= fVar5) {
      fVar6 = fVar5;
    }
    local_48.y = extraout_XMM0_Db - fVar6;
    local_48.x = extraout_XMM0_Da - fVar6;
    local_48.w = fVar6 + fVar6 + (float)in_XMM1_Qa;
    local_48.h = fVar6 + fVar6 + local_48.h;
  }
  pSVar4 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->m_markerPositions).
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 == pSVar3) {
    fVar6 = local_48.x;
    fVar5 = local_48.y;
  }
  else {
    do {
      local_38 = SVGMarkerElement::markerBoundingBox
                           (pSVar4->m_element,&pSVar4->m_origin,pSVar4->m_angle,
                            (this->m_strokeData).m_lineWidth);
      local_48 = Rect::united(&local_48,&local_38);
      fVar6 = local_48.x;
      fVar5 = local_48.y;
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar3);
  }
  RVar9.y = fVar5;
  RVar9.x = fVar6;
  RVar9.w = local_48.w;
  RVar9.h = local_48.h;
  return RVar9;
}

Assistant:

Rect SVGGeometryElement::strokeBoundingBox() const
{
    auto strokeBoundingBox = fillBoundingBox();
    if(m_stroke.isRenderable()) {
        float capLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineCap() == LineCap::Square)
            capLimit *= PLUTOVG_SQRT2;
        float joinLimit = m_strokeData.lineWidth() / 2.f;
        if(m_strokeData.lineJoin() == LineJoin::Miter) {
            joinLimit *= m_strokeData.miterLimit();
        }

        strokeBoundingBox.inflate(std::max(capLimit, joinLimit));
    }

    for(const auto& markerPosition : m_markerPositions)
        strokeBoundingBox.unite(markerPosition.markerBoundingBox(m_strokeData.lineWidth()));
    return strokeBoundingBox;
}